

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O1

bool __thiscall
btConvexHullInternal::shiftFace
          (btConvexHullInternal *this,Face *face,btScalar amount,
          btAlignedObjectArray<btConvexHullInternal::Vertex_*> *stack)

{
  Int128 *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Face *pFVar5;
  Face *pFVar6;
  Edge *pEVar7;
  Vertex *this_01;
  undefined1 auVar8 [12];
  PointR128 *pPVar9;
  PointR128 *pPVar10;
  int iVar11;
  uint uVar12;
  Edge *pEVar13;
  Vertex **ppVVar14;
  Edge *pEVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  Vertex *pVVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  Edge *pEVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  uint64_t lo_2;
  long b;
  long lVar32;
  ulong uVar33;
  Edge *pEVar34;
  Edge *e;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  bool bVar39;
  bool bVar40;
  btScalar bVar41;
  btScalar bVar42;
  float fVar43;
  float fVar44;
  btVector3 bVar45;
  Int128 IVar46;
  Int128 IVar47;
  Int128 IVar48;
  Int128 IVar49;
  Int128 IVar50;
  Int128 IVar51;
  Int128 IVar52;
  Int128 IVar53;
  int curSize;
  btVector3 origShift;
  Point64 normal;
  Int128 det;
  Rational128 dot;
  Rational128 optDot;
  uint local_1d8;
  uint local_1d4;
  Edge *local_1b0;
  uint64_t local_158;
  undefined1 local_148 [8];
  float fStack_140;
  undefined4 uStack_13c;
  uint64_t local_138;
  uint64_t local_130;
  uint64_t local_128;
  Vertex *local_120;
  ulong local_118;
  Edge *local_110;
  Point64 local_108;
  ulong local_f0;
  long local_e8;
  Edge *local_e0;
  Int128 local_d8;
  Rational128 local_c8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  Pool<btConvexHullInternal::Vertex> *local_80;
  uint64_t local_78;
  uint64_t local_70;
  Edge *local_68;
  Vertex *local_60;
  Rational128 local_58;
  
  bVar45 = getBtNormal(this,face);
  fVar44 = (float)((uint)amount ^ (uint)DAT_001f5270);
  fVar43 = fVar44 * bVar45.m_floats[0];
  auVar8._4_4_ = fVar44 * bVar45.m_floats[1];
  auVar8._0_4_ = fVar43;
  auVar8._8_4_ = fVar44 * bVar45.m_floats[2];
  uStack_13c = 0;
  _local_148 = auVar8;
  fVar44 = (this->scaling).m_floats[0];
  if ((fVar44 != 0.0) || (NAN(fVar44))) {
    stack0xfffffffffffffebc = auVar8._4_8_;
    local_148._0_4_ = fVar43 / fVar44;
    uStack_13c = 0;
  }
  fVar44 = (this->scaling).m_floats[1];
  if ((fVar44 != 0.0) || (NAN(fVar44))) {
    local_148._4_4_ = (float)local_148._4_4_ / fVar44;
  }
  fVar44 = (this->scaling).m_floats[2];
  if ((fVar44 != 0.0) || (NAN(fVar44))) {
    fStack_140 = fStack_140 / fVar44;
  }
  if ((((int)*(float *)(local_148 + (long)this->medAxis * 4) == 0) &&
      ((int)*(float *)(local_148 + (long)this->maxAxis * 4) == 0)) &&
     ((int)*(float *)(local_148 + (long)this->minAxis * 4) == 0)) {
    return true;
  }
  iVar11 = (face->dir0).x;
  iVar24 = (face->dir0).y;
  iVar1 = (face->dir1).z;
  iVar2 = (face->dir0).z;
  iVar3 = (face->dir1).y;
  local_108.x = (int64_t)(iVar1 * iVar24 - iVar3 * iVar2);
  iVar4 = (face->dir1).x;
  local_108.y = (int64_t)(iVar2 * iVar4 - iVar1 * iVar11);
  local_108.z = (int64_t)(iVar11 * iVar3 - iVar4 * iVar24);
  lVar29 = (long)(face->origin).x;
  local_118 = (int)*(float *)(local_148 + (long)this->medAxis * 4) + lVar29;
  lVar22 = (long)(face->origin).y;
  local_e8 = (int)*(float *)(local_148 + (long)this->maxAxis * 4) + lVar22;
  lVar16 = (long)(face->origin).z;
  local_f0 = (int)*(float *)(local_148 + (long)this->minAxis * 4) + lVar16;
  b = local_108.z * local_f0 + local_108.y * local_e8 + local_108.x * local_118;
  if (lVar16 * local_108.z + lVar22 * local_108.y + lVar29 * local_108.x <= b) {
    return false;
  }
  pEVar27 = face->nearbyVertex->edges;
  Vertex::dot(&local_58,face->nearbyVertex,&local_108);
  local_1d4 = Rational128::compare(&local_58,b);
  local_1d8 = local_1d4;
  if ((int)local_1d4 < 0) {
    pEVar15 = (Edge *)0x0;
    pEVar13 = pEVar27;
    do {
      pEVar34 = pEVar13;
      Vertex::dot(&local_c8,pEVar34->target,&local_108);
      iVar11 = Rational128::compare(&local_c8,&local_58);
      pEVar13 = pEVar34;
      if (iVar11 < 1) {
LAB_0012c33c:
        bVar40 = false;
        pEVar34 = pEVar15;
        pEVar13 = pEVar13->prev;
      }
      else {
        local_1d8 = Rational128::compare(&local_c8,b);
        bVar40 = true;
        if ((int)local_1d8 < 0) {
          local_58.denominator.low = local_c8.denominator.low;
          local_58.numerator.low = local_c8.numerator.low;
          local_58.numerator.high = local_c8.numerator.high;
          pEVar27 = pEVar34->reverse;
          pEVar13 = pEVar27;
          goto LAB_0012c33c;
        }
      }
    } while ((!bVar40) && (pEVar15 = pEVar34, pEVar13 != pEVar27));
    if (pEVar34 == (Edge *)0x0) {
      return true;
    }
  }
  else {
    pEVar34 = (Edge *)0x0;
    pEVar15 = pEVar27;
    do {
      Vertex::dot(&local_c8,pEVar15->target,&local_108);
      iVar11 = Rational128::compare(&local_c8,&local_58);
      uVar12 = local_1d8;
      if (iVar11 < 0) {
        uVar12 = Rational128::compare(&local_c8,b);
        local_58.denominator.low = local_c8.denominator.low;
        local_58.numerator.low = local_c8.numerator.low;
        local_58.numerator.high = local_c8.numerator.high;
        pEVar27 = pEVar15->reverse;
        pEVar15 = pEVar27;
        if (-1 < (int)uVar12) goto LAB_0012c271;
        uVar12 = uVar12 >> 0x1e & 0xfffffffe;
        pEVar34 = pEVar27;
      }
      else {
LAB_0012c271:
        local_1d8 = uVar12;
        uVar12 = 0;
        pEVar15 = pEVar15->prev;
      }
    } while ((uVar12 == 0) && (pEVar15 != pEVar27));
    if (pEVar34 == (Edge *)0x0) {
      return false;
    }
  }
  local_1d4 = local_1d4 >> 0x1f;
  if (local_1d8 == 0) {
    pEVar27 = pEVar34->reverse->next;
    do {
      Vertex::dot(&local_c8,pEVar27->target,&local_108);
      iVar11 = Rational128::compare(&local_c8,b);
      if (0 < iVar11) goto LAB_0012c3b3;
      pEVar27 = pEVar27->next;
    } while (pEVar27 != pEVar34->reverse);
    local_1d4 = 1;
LAB_0012c3b3:
    if (iVar11 < 1) {
      return local_1d4._0_1_;
    }
  }
  local_98 = local_e8 << 0x20;
  local_a0 = local_f0 | 0xffffffff00000000;
  local_80 = &this->vertexPool;
  local_1b0 = (Edge *)0x0;
  local_88 = (long)(int)local_e8;
  local_90 = (long)(int)local_f0;
  local_e0 = (Edge *)0x0;
  pEVar27 = (Edge *)0x0;
  do {
    pEVar15 = pEVar34;
    if (local_1d8 == 0) {
      pEVar15 = pEVar34->reverse->next;
      Vertex::dot(&local_c8,pEVar15->target,&local_108);
      iVar11 = Rational128::compare(&local_c8,b);
      bVar40 = -1 < iVar11;
      if (!bVar40) {
        pEVar34 = pEVar15->reverse;
        for (pEVar13 = pEVar15->next; pEVar13 != pEVar15; pEVar13 = pEVar13->next) {
          Vertex::dot(&local_c8,pEVar13->target,&local_108);
          iVar11 = Rational128::compare(&local_c8,b);
          bVar40 = -1 < iVar11;
          if (bVar40) goto LAB_0012c4c7;
          pEVar34 = pEVar13->reverse;
        }
        local_1d4 = 1;
      }
LAB_0012c4c7:
      pEVar15 = pEVar34;
      if (!bVar40) {
        return local_1d4._0_1_;
      }
    }
    pEVar13 = pEVar15;
    if ((local_e0 != (Edge *)0x0) && (pEVar13 = local_e0, pEVar15 == local_e0)) {
      if ((int)local_1d8 < 1) {
        if (local_1b0 != pEVar27->reverse) {
          btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back(stack,&pEVar27->target);
          pEVar15 = local_1b0->next;
          if (pEVar15 != pEVar27->reverse) {
            do {
              pVVar23 = pEVar15->target;
              removeEdgePair(this,pEVar15);
              iVar11 = stack->m_size;
              if (iVar11 == stack->m_capacity) {
                iVar24 = iVar11 * 2;
                if (iVar11 == 0) {
                  iVar24 = 1;
                }
                if (stack->m_capacity < iVar24) {
                  if (iVar24 == 0) {
                    ppVVar14 = (Vertex **)0x0;
                  }
                  else {
                    ppVVar14 = (Vertex **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
                  }
                  iVar11 = stack->m_size;
                  if (0 < (long)iVar11) {
                    lVar16 = 0;
                    do {
                      ppVVar14[lVar16] = stack->m_data[lVar16];
                      lVar16 = lVar16 + 1;
                    } while (iVar11 != lVar16);
                  }
                  if (stack->m_data != (Vertex **)0x0) {
                    if (stack->m_ownsMemory == true) {
                      btAlignedFreeInternal(stack->m_data);
                    }
                    stack->m_data = (Vertex **)0x0;
                  }
                  stack->m_ownsMemory = true;
                  stack->m_data = ppVVar14;
                  stack->m_capacity = iVar24;
                }
              }
              iVar11 = stack->m_size;
              stack->m_data[iVar11] = pVVar23;
              stack->m_size = iVar11 + 1;
              pEVar15 = local_1b0->next;
            } while (pEVar15 != pEVar27->reverse);
          }
          local_c8.numerator.low = 0;
          btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back
                    (stack,(Vertex **)&local_c8);
        }
      }
      else {
        local_1b0->reverse->target = pEVar27->target;
        pEVar15 = local_e0->reverse;
        pEVar15->next = local_1b0;
        local_1b0->prev = pEVar15;
        pEVar27 = pEVar27->reverse;
        local_1b0->next = pEVar27;
        pEVar27->prev = local_1b0;
      }
      this->vertexList = *stack->m_data;
      local_1d8 = stack->m_size;
      if (0 < (int)local_1d8) {
        uVar20 = 0;
        do {
          iVar11 = (int)uVar20;
          pVVar23 = stack->m_data[(long)iVar11 + 1];
          uVar20 = (ulong)(iVar11 + 2U);
          if (pVVar23 == (Vertex *)0x0) {
            bVar40 = false;
          }
          else {
            this_01 = stack->m_data[iVar11];
            uVar20 = (ulong)(int)(iVar11 + 2U);
            bVar40 = false;
            do {
              Vertex::receiveNearbyFaces(this_01,pVVar23);
              while (pVVar23->edges != (Edge *)0x0) {
                if (!bVar40) {
                  iVar11 = stack->m_size;
                  if (iVar11 == stack->m_capacity) {
                    iVar24 = iVar11 * 2;
                    if (iVar11 == 0) {
                      iVar24 = 1;
                    }
                    if (stack->m_capacity < iVar24) {
                      if (iVar24 == 0) {
                        ppVVar14 = (Vertex **)0x0;
                      }
                      else {
                        ppVVar14 = (Vertex **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
                      }
                      iVar11 = stack->m_size;
                      if (0 < (long)iVar11) {
                        lVar16 = 0;
                        do {
                          ppVVar14[lVar16] = stack->m_data[lVar16];
                          lVar16 = lVar16 + 1;
                        } while (iVar11 != lVar16);
                      }
                      if (stack->m_data != (Vertex **)0x0) {
                        if (stack->m_ownsMemory == true) {
                          btAlignedFreeInternal(stack->m_data);
                        }
                        stack->m_data = (Vertex **)0x0;
                      }
                      stack->m_ownsMemory = true;
                      stack->m_data = ppVVar14;
                      stack->m_capacity = iVar24;
                    }
                  }
                  iVar11 = stack->m_size;
                  stack->m_data[iVar11] = this_01;
                  stack->m_size = iVar11 + 1;
                  bVar40 = true;
                }
                pEVar27 = pVVar23->edges;
                iVar11 = stack->m_size;
                if (iVar11 == stack->m_capacity) {
                  iVar24 = iVar11 * 2;
                  if (iVar11 == 0) {
                    iVar24 = 1;
                  }
                  if (stack->m_capacity < iVar24) {
                    if (iVar24 == 0) {
                      ppVVar14 = (Vertex **)0x0;
                    }
                    else {
                      ppVVar14 = (Vertex **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
                    }
                    iVar11 = stack->m_size;
                    if (0 < (long)iVar11) {
                      lVar16 = 0;
                      do {
                        ppVVar14[lVar16] = stack->m_data[lVar16];
                        lVar16 = lVar16 + 1;
                      } while (iVar11 != lVar16);
                    }
                    if (stack->m_data != (Vertex **)0x0) {
                      if (stack->m_ownsMemory == true) {
                        btAlignedFreeInternal(stack->m_data);
                      }
                      stack->m_data = (Vertex **)0x0;
                    }
                    stack->m_ownsMemory = true;
                    stack->m_data = ppVVar14;
                    stack->m_capacity = iVar24;
                  }
                }
                iVar11 = stack->m_size;
                stack->m_data[iVar11] = pEVar27->target;
                stack->m_size = iVar11 + 1;
                removeEdgePair(this,pVVar23->edges);
              }
              pVVar23 = stack->m_data[uVar20];
              uVar20 = uVar20 + 1;
            } while (pVVar23 != (Vertex *)0x0);
          }
          if (bVar40) {
            iVar11 = stack->m_size;
            if (iVar11 == stack->m_capacity) {
              iVar24 = iVar11 * 2;
              if (iVar11 == 0) {
                iVar24 = 1;
              }
              if (stack->m_capacity < iVar24) {
                if (iVar24 == 0) {
                  ppVVar14 = (Vertex **)0x0;
                }
                else {
                  ppVVar14 = (Vertex **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
                }
                iVar11 = stack->m_size;
                if (0 < (long)iVar11) {
                  lVar16 = 0;
                  do {
                    ppVVar14[lVar16] = stack->m_data[lVar16];
                    lVar16 = lVar16 + 1;
                  } while (iVar11 != lVar16);
                }
                if (stack->m_data != (Vertex **)0x0) {
                  if (stack->m_ownsMemory == true) {
                    btAlignedFreeInternal(stack->m_data);
                  }
                  stack->m_data = (Vertex **)0x0;
                }
                stack->m_ownsMemory = true;
                stack->m_data = ppVVar14;
                stack->m_capacity = iVar24;
              }
            }
            iVar11 = stack->m_size;
            stack->m_data[iVar11] = (Vertex *)0x0;
            stack->m_size = iVar11 + 1;
          }
        } while (((int)uVar20 < (int)local_1d8) ||
                (local_1d8 = stack->m_size, (int)uVar20 < (int)local_1d8));
      }
      if (((int)local_1d8 < 1) && ((int)local_1d8 < 0)) {
        if (stack->m_capacity < 0) {
          if (stack->m_data != (Vertex **)0x0) {
            if (stack->m_ownsMemory == true) {
              btAlignedFreeInternal(stack->m_data);
            }
            stack->m_data = (Vertex **)0x0;
          }
          stack->m_ownsMemory = true;
          stack->m_data = (Vertex **)0x0;
          stack->m_capacity = 0;
        }
        if ((int)local_1d8 < 0) {
          lVar16 = (long)(int)local_1d8;
          do {
            stack->m_data[lVar16] = (Vertex *)0x0;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0);
        }
      }
      stack->m_size = 0;
      local_98 = local_98 | local_118 & 0xffffffff;
      (face->origin).x = (int)local_98;
      (face->origin).y = (int)(local_98 >> 0x20);
      (face->origin).z = (undefined4)local_a0;
      (face->origin).index = local_a0._4_4_;
      return true;
    }
    pEVar34 = pEVar15->reverse;
    local_110 = pEVar15;
    local_e0 = pEVar13;
    do {
      pEVar34 = pEVar34->reverse->prev;
      Vertex::dot(&local_c8,pEVar34->target,&local_108);
      uVar12 = Rational128::compare(&local_c8,b);
    } while ((int)uVar12 < 0);
    if (uVar12 != 0) {
      local_68 = pEVar34->reverse;
      local_60 = pEVar34->target;
      pEVar15 = local_68->prev;
      if (pEVar15 == local_68) {
        local_60->edges = (Edge *)0x0;
      }
      else {
        local_60->edges = pEVar15;
        pEVar13 = local_68->next;
        pEVar15->next = pEVar13;
        pEVar13->prev = pEVar15;
        local_68->next = local_68;
        local_68->prev = local_68;
      }
      pFVar5 = pEVar34->face;
      iVar11 = (pFVar5->dir0).x;
      iVar24 = (pFVar5->dir0).y;
      iVar1 = (pFVar5->dir1).z;
      iVar2 = (pFVar5->dir0).z;
      iVar3 = (pFVar5->dir1).y;
      lVar26 = (long)(iVar1 * iVar24 - iVar3 * iVar2);
      iVar4 = (pFVar5->dir1).x;
      local_120 = (Vertex *)(long)(iVar2 * iVar4 - iVar1 * iVar11);
      lVar17 = (long)(iVar11 * iVar3 - iVar4 * iVar24);
      pFVar6 = local_68->face;
      iVar11 = (pFVar6->dir0).x;
      iVar24 = (pFVar6->dir0).y;
      iVar1 = (pFVar6->dir1).z;
      iVar2 = (pFVar6->dir0).z;
      iVar3 = (pFVar6->dir1).y;
      iVar4 = (pFVar6->dir1).x;
      lVar32 = (long)(face->dir0).x;
      lVar35 = (long)(face->dir0).y;
      lVar16 = (long)(face->dir0).z;
      lVar22 = lVar16 * lVar17 + lVar35 * (long)local_120 + lVar32 * lVar26;
      lVar28 = (long)(face->dir1).x;
      lVar29 = (long)(face->dir1).y;
      lVar31 = (long)(face->dir1).z;
      lVar18 = lVar31 * lVar17 + lVar29 * (long)local_120 + lVar28 * lVar26;
      lVar25 = (long)(iVar1 * iVar24 - iVar3 * iVar2);
      lVar19 = (long)(iVar2 * iVar4 - iVar1 * iVar11);
      lVar30 = (long)(iVar11 * iVar3 - iVar4 * iVar24);
      lVar32 = lVar16 * lVar30 + lVar35 * lVar19 + lVar32 * lVar25;
      lVar28 = lVar31 * lVar30 + lVar29 * lVar19 + lVar28 * lVar25;
      lVar16 = ((pFVar5->origin).z - local_90) * lVar17 +
               ((pFVar5->origin).y - local_88) * (long)local_120 +
               ((long)(pFVar5->origin).x - (long)(int)local_118) * lVar26;
      lVar29 = ((pFVar6->origin).z - local_90) * lVar30 +
               ((pFVar6->origin).y - local_88) * lVar19 +
               ((long)(pFVar6->origin).x - (long)(int)local_118) * lVar25;
      IVar46 = Int128::mul(lVar22,lVar28);
      IVar47 = Int128::mul(lVar18,lVar32);
      local_d8.low = IVar46.low - IVar47.low;
      local_d8.high =
           ~IVar47.high + IVar46.high + (ulong)(IVar47.low == 0) +
           (ulong)(local_d8.low < IVar46.low);
      local_120 = Pool<btConvexHullInternal::Vertex>::newObject(local_80);
      *(undefined8 *)&(local_120->point).index = 0xffffffffffffffff;
      lVar17 = (long)(face->dir0).x;
      IVar46 = Int128::mul(lVar16 * lVar17,lVar28);
      IVar47 = Int128::mul(lVar17 * lVar29,lVar18);
      local_130 = IVar47.high;
      local_128 = IVar46.low - IVar47.low;
      lVar17 = (long)(face->dir1).x;
      IVar48 = Int128::mul(lVar29 * lVar17,lVar22);
      IVar49 = Int128::mul(lVar17 * lVar16,lVar32);
      local_138 = IVar49.high;
      IVar50 = Int128::operator*(&local_d8,local_118);
      bVar40 = local_128 < IVar46.low;
      bVar39 = CARRY8(IVar48.low,local_128);
      uVar36 = IVar48.low + local_128;
      uVar20 = uVar36 - IVar49.low;
      local_128 = uVar20 + IVar50.low;
      local_130 = (ulong)(uVar20 < uVar36) +
                  (ulong)(IVar49.low == 0) +
                  (((IVar46.high - local_130) + IVar48.high + (ulong)(IVar47.low == 0)) - local_138)
                  + IVar50.high + (ulong)bVar40 + -2 + (ulong)bVar39 +
                  (ulong)CARRY8(uVar20,IVar50.low);
      lVar17 = (long)(face->dir0).y;
      IVar46 = Int128::mul(lVar16 * lVar17,lVar28);
      IVar47 = Int128::mul(lVar17 * lVar29,lVar18);
      uVar20 = IVar46.low - IVar47.low;
      lVar17 = (long)(face->dir1).y;
      IVar48 = Int128::mul(lVar29 * lVar17,lVar22);
      local_70 = IVar48.high;
      IVar49 = Int128::mul(lVar17 * lVar16,lVar32);
      local_78 = IVar49.high;
      local_138 = IVar49.low;
      bVar40 = local_138 == 0;
      IVar49 = Int128::operator*(&local_d8,local_e8);
      local_158 = IVar47.high;
      lVar17 = ((IVar46.high - local_158) + local_70 + (ulong)(IVar47.low == 0)) - local_78;
      uVar37 = IVar48.low + uVar20;
      uVar36 = uVar37 - local_138;
      lVar19 = (long)(face->dir0).z;
      IVar47 = Int128::mul(lVar16 * lVar19,lVar28);
      IVar50 = Int128::mul(lVar19 * lVar29,lVar18);
      uVar38 = IVar47.low - IVar50.low;
      lVar18 = (long)(face->dir1).z;
      IVar51 = Int128::mul(lVar29 * lVar18,lVar22);
      IVar52 = Int128::mul(lVar16 * lVar18,lVar32);
      IVar53 = Int128::operator*(&local_d8,local_f0);
      pVVar23 = local_120;
      local_158 = IVar50.high;
      uVar33 = IVar51.low + uVar38;
      uVar21 = uVar33 - IVar52.low;
      (local_120->point128).x.low = local_128;
      (local_120->point128).x.high = local_130;
      (local_120->point128).y.low = uVar36 + IVar49.low;
      (local_120->point128).y.high =
           (ulong)(uVar36 < uVar37) +
           (ulong)bVar40 + lVar17 + IVar49.high + (ulong)(uVar20 < IVar46.low) + -2 +
           (ulong)CARRY8(IVar48.low,uVar20) + (ulong)CARRY8(uVar36,IVar49.low);
      pPVar9 = &local_120->point128;
      (local_120->point128).z.low = uVar21 + IVar53.low;
      pPVar10 = &local_120->point128;
      (local_120->point128).z.high =
           (ulong)(uVar21 < uVar33) +
           (ulong)(IVar52.low == 0) +
           (((IVar47.high - local_158) + IVar51.high + (ulong)(IVar50.low == 0)) - IVar52.high) +
           IVar53.high + (ulong)(uVar38 < IVar47.low) + -2 + (ulong)CARRY8(IVar51.low,uVar38) +
           (ulong)CARRY8(uVar21,IVar53.low);
      this_00 = &(local_120->point128).denominator;
      (local_120->point128).denominator.low = local_d8.low;
      (local_120->point128).denominator.high = local_d8.high;
      bVar41 = Int128::toScalar(&(local_120->point128).x);
      bVar42 = Int128::toScalar(this_00);
      (pVVar23->point).x = (int)(bVar41 / bVar42);
      bVar41 = Int128::toScalar(&pPVar9->y);
      bVar42 = Int128::toScalar(this_00);
      (pVVar23->point).y = (int)(bVar41 / bVar42);
      bVar41 = Int128::toScalar(&pPVar10->z);
      bVar42 = Int128::toScalar(this_00);
      (pVVar23->point).z = (int)(bVar41 / bVar42);
      pEVar34->target = pVVar23;
      pVVar23->edges = local_68;
      iVar11 = stack->m_size;
      if (iVar11 == stack->m_capacity) {
        iVar24 = iVar11 * 2;
        if (iVar11 == 0) {
          iVar24 = 1;
        }
        if (stack->m_capacity < iVar24) {
          if (iVar24 == 0) {
            ppVVar14 = (Vertex **)0x0;
          }
          else {
            ppVVar14 = (Vertex **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
          }
          iVar11 = stack->m_size;
          if (0 < (long)iVar11) {
            lVar16 = 0;
            do {
              ppVVar14[lVar16] = stack->m_data[lVar16];
              lVar16 = lVar16 + 1;
            } while (iVar11 != lVar16);
          }
          if (stack->m_data != (Vertex **)0x0) {
            if (stack->m_ownsMemory == true) {
              btAlignedFreeInternal(stack->m_data);
            }
            stack->m_data = (Vertex **)0x0;
          }
          stack->m_ownsMemory = true;
          stack->m_data = ppVVar14;
          stack->m_capacity = iVar24;
        }
      }
      iVar11 = stack->m_size;
      stack->m_data[iVar11] = pVVar23;
      iVar11 = iVar11 + 1;
      stack->m_size = iVar11;
      if (iVar11 == stack->m_capacity) {
        iVar24 = iVar11 * 2;
        if (iVar11 == 0) {
          iVar24 = 1;
        }
        if (stack->m_capacity < iVar24) {
          if (iVar24 == 0) {
            ppVVar14 = (Vertex **)0x0;
          }
          else {
            ppVVar14 = (Vertex **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
          }
          iVar11 = stack->m_size;
          if (0 < (long)iVar11) {
            lVar16 = 0;
            do {
              ppVVar14[lVar16] = stack->m_data[lVar16];
              lVar16 = lVar16 + 1;
            } while (iVar11 != lVar16);
          }
          if (stack->m_data != (Vertex **)0x0) {
            if (stack->m_ownsMemory == true) {
              btAlignedFreeInternal(stack->m_data);
            }
            stack->m_data = (Vertex **)0x0;
          }
          stack->m_ownsMemory = true;
          stack->m_data = ppVVar14;
          stack->m_capacity = iVar24;
        }
      }
      iVar11 = stack->m_size;
      stack->m_data[iVar11] = local_60;
      iVar11 = iVar11 + 1;
      stack->m_size = iVar11;
      if (iVar11 == stack->m_capacity) {
        iVar24 = iVar11 * 2;
        if (iVar11 == 0) {
          iVar24 = 1;
        }
        if (stack->m_capacity < iVar24) {
          if (iVar24 == 0) {
            ppVVar14 = (Vertex **)0x0;
          }
          else {
            ppVVar14 = (Vertex **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
          }
          iVar11 = stack->m_size;
          if (0 < (long)iVar11) {
            lVar16 = 0;
            do {
              ppVVar14[lVar16] = stack->m_data[lVar16];
              lVar16 = lVar16 + 1;
            } while (iVar11 != lVar16);
          }
          if (stack->m_data != (Vertex **)0x0) {
            if (stack->m_ownsMemory == true) {
              btAlignedFreeInternal(stack->m_data);
            }
            stack->m_data = (Vertex **)0x0;
          }
          stack->m_ownsMemory = true;
          stack->m_data = ppVVar14;
          stack->m_capacity = iVar24;
        }
      }
      iVar11 = stack->m_size;
      stack->m_data[iVar11] = (Vertex *)0x0;
      stack->m_size = iVar11 + 1;
    }
    if ((uVar12 != 0 || local_1d8 != 0) ||
       (pEVar15 = local_110->reverse->next, pEVar15->target != pEVar34->target)) {
      pEVar15 = newEdgePair(this,local_110->target,pEVar34->target);
      if (local_1d8 == 0) {
        pEVar13 = local_110->reverse->next;
        pEVar15->next = pEVar13;
        pEVar13->prev = pEVar15;
      }
      if ((pEVar27 != (Edge *)0x0) || (local_1d8 == 0)) {
        pEVar13 = local_110->reverse;
        pEVar13->next = pEVar15;
        pEVar15->prev = pEVar13;
      }
      if (uVar12 == 0) {
        pEVar13 = pEVar34->reverse->prev;
        pEVar7 = pEVar15->reverse;
        pEVar13->next = pEVar7;
        pEVar7->prev = pEVar13;
      }
      pEVar13 = pEVar15->reverse;
      pEVar7 = pEVar34->reverse;
      pEVar13->next = pEVar7;
      pEVar7->prev = pEVar13;
    }
    if (pEVar27 != (Edge *)0x0) {
      pEVar13 = pEVar27->reverse;
      if ((int)local_1d8 < 1) {
        if (pEVar15 != pEVar13) {
          iVar11 = stack->m_size;
          if (iVar11 == stack->m_capacity) {
            iVar24 = iVar11 * 2;
            if (iVar11 == 0) {
              iVar24 = 1;
            }
            if (stack->m_capacity < iVar24) {
              if (iVar24 == 0) {
                ppVVar14 = (Vertex **)0x0;
              }
              else {
                ppVVar14 = (Vertex **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
              }
              iVar11 = stack->m_size;
              if (0 < (long)iVar11) {
                lVar16 = 0;
                do {
                  ppVVar14[lVar16] = stack->m_data[lVar16];
                  lVar16 = lVar16 + 1;
                } while (iVar11 != lVar16);
              }
              if (stack->m_data != (Vertex **)0x0) {
                if (stack->m_ownsMemory == true) {
                  btAlignedFreeInternal(stack->m_data);
                }
                stack->m_data = (Vertex **)0x0;
              }
              stack->m_ownsMemory = true;
              stack->m_data = ppVVar14;
              stack->m_capacity = iVar24;
            }
          }
          iVar11 = stack->m_size;
          stack->m_data[iVar11] = pEVar27->target;
          stack->m_size = iVar11 + 1;
          while (pEVar13 = pEVar15->next, pEVar13 != pEVar27->reverse) {
            pVVar23 = pEVar13->target;
            removeEdgePair(this,pEVar13);
            iVar11 = stack->m_size;
            if (iVar11 == stack->m_capacity) {
              iVar24 = iVar11 * 2;
              if (iVar11 == 0) {
                iVar24 = 1;
              }
              if (stack->m_capacity < iVar24) {
                if (iVar24 == 0) {
                  ppVVar14 = (Vertex **)0x0;
                }
                else {
                  ppVVar14 = (Vertex **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
                }
                iVar11 = stack->m_size;
                if (0 < (long)iVar11) {
                  lVar16 = 0;
                  do {
                    ppVVar14[lVar16] = stack->m_data[lVar16];
                    lVar16 = lVar16 + 1;
                  } while (iVar11 != lVar16);
                }
                if (stack->m_data != (Vertex **)0x0) {
                  if (stack->m_ownsMemory == true) {
                    btAlignedFreeInternal(stack->m_data);
                  }
                  stack->m_data = (Vertex **)0x0;
                }
                stack->m_ownsMemory = true;
                stack->m_data = ppVVar14;
                stack->m_capacity = iVar24;
              }
            }
            iVar11 = stack->m_size;
            stack->m_data[iVar11] = pVVar23;
            stack->m_size = iVar11 + 1;
          }
          iVar11 = stack->m_size;
          if (iVar11 == stack->m_capacity) {
            iVar24 = iVar11 * 2;
            if (iVar11 == 0) {
              iVar24 = 1;
            }
            if (stack->m_capacity < iVar24) {
              if (iVar24 == 0) {
                ppVVar14 = (Vertex **)0x0;
              }
              else {
                ppVVar14 = (Vertex **)btAlignedAllocInternal((long)iVar24 << 3,0x10);
              }
              iVar11 = stack->m_size;
              if (0 < (long)iVar11) {
                lVar16 = 0;
                do {
                  ppVVar14[lVar16] = stack->m_data[lVar16];
                  lVar16 = lVar16 + 1;
                } while (iVar11 != lVar16);
              }
              if (stack->m_data != (Vertex **)0x0) {
                if (stack->m_ownsMemory == true) {
                  btAlignedFreeInternal(stack->m_data);
                }
                stack->m_data = (Vertex **)0x0;
              }
              stack->m_ownsMemory = true;
              stack->m_data = ppVVar14;
              stack->m_capacity = iVar24;
            }
          }
          iVar11 = stack->m_size;
          stack->m_data[iVar11] = (Vertex *)0x0;
          stack->m_size = iVar11 + 1;
        }
      }
      else {
        pEVar15->next = pEVar13;
        pEVar13->prev = pEVar15;
      }
    }
    pEVar15->face = face;
    pEVar15->reverse->face = pEVar34->face;
    pEVar27 = pEVar15;
    local_1d8 = uVar12;
    if (local_1b0 == (Edge *)0x0) {
      local_1b0 = pEVar15;
    }
  } while( true );
}

Assistant:

bool btConvexHullInternal::shiftFace(Face* face, btScalar amount, btAlignedObjectArray<Vertex*> stack)
{
	btVector3 origShift = getBtNormal(face) * -amount;
	if (scaling[0] != 0)
	{
		origShift[0] /= scaling[0];
	}
	if (scaling[1] != 0)
	{
		origShift[1] /= scaling[1];
	}
	if (scaling[2] != 0)
	{
		origShift[2] /= scaling[2];
	}
	Point32 shift((int32_t) origShift[medAxis], (int32_t) origShift[maxAxis], (int32_t) origShift[minAxis]);
	if (shift.isZero())
	{
		return true;
	}
	Point64 normal = face->getNormal();
#ifdef DEBUG_CONVEX_HULL
	printf("\nShrinking face (%d %d %d) (%d %d %d) (%d %d %d) by (%d %d %d)\n",
				 face->origin.x, face->origin.y, face->origin.z, face->dir0.x, face->dir0.y, face->dir0.z, face->dir1.x, face->dir1.y, face->dir1.z, shift.x, shift.y, shift.z);
#endif
	int64_t origDot = face->origin.dot(normal);
	Point32 shiftedOrigin = face->origin + shift;
	int64_t shiftedDot = shiftedOrigin.dot(normal);
	btAssert(shiftedDot <= origDot);
	if (shiftedDot >= origDot)
	{
		return false;
	}

	Edge* intersection = NULL;

	Edge* startEdge = face->nearbyVertex->edges;
#ifdef DEBUG_CONVEX_HULL
	printf("Start edge is ");
	startEdge->print();
	printf(", normal is (%lld %lld %lld), shifted dot is %lld\n", normal.x, normal.y, normal.z, shiftedDot);
#endif
	Rational128 optDot = face->nearbyVertex->dot(normal);
	int cmp = optDot.compare(shiftedDot);
#ifdef SHOW_ITERATIONS
	int n = 0;
#endif
	if (cmp >= 0)
	{
		Edge* e = startEdge;
		do
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			Rational128 dot = e->target->dot(normal);
			btAssert(dot.compare(origDot) <= 0);
#ifdef DEBUG_CONVEX_HULL
			printf("Moving downwards, edge is ");
			e->print();
			printf(", dot is %f (%f %lld)\n", (float) dot.toScalar(), (float) optDot.toScalar(), shiftedDot);
#endif
			if (dot.compare(optDot) < 0)
			{
				int c = dot.compare(shiftedDot);
				optDot = dot;
				e = e->reverse;
				startEdge = e;
				if (c < 0)
				{
					intersection = e;
					break;
				}
				cmp = c;
			}
			e = e->prev;
		} while (e != startEdge);

		if (!intersection)
		{
			return false;
		}
	}
	else
	{
		Edge* e = startEdge;
		do
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			Rational128 dot = e->target->dot(normal);
			btAssert(dot.compare(origDot) <= 0);
#ifdef DEBUG_CONVEX_HULL
			printf("Moving upwards, edge is ");
			e->print();
			printf(", dot is %f (%f %lld)\n", (float) dot.toScalar(), (float) optDot.toScalar(), shiftedDot);
#endif
			if (dot.compare(optDot) > 0)
			{
				cmp = dot.compare(shiftedDot);
				if (cmp >= 0)
				{
					intersection = e;
					break;
				}
				optDot = dot;
				e = e->reverse;
				startEdge = e;
			}
			e = e->prev;
		} while (e != startEdge);
		
		if (!intersection)
		{
			return true;
		}
	}

#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to find initial intersection\n", n);
#endif

	if (cmp == 0)
	{
		Edge* e = intersection->reverse->next;
#ifdef SHOW_ITERATIONS
		n = 0;
#endif
		while (e->target->dot(normal).compare(shiftedDot) <= 0)
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			e = e->next;
			if (e == intersection->reverse)
			{
				return true;
			}
#ifdef DEBUG_CONVEX_HULL
			printf("Checking for outwards edge, current edge is ");
			e->print();
			printf("\n");
#endif
		}
#ifdef SHOW_ITERATIONS
		printf("Needed %d iterations to check for complete containment\n", n);
#endif
	}
	
	Edge* firstIntersection = NULL;
	Edge* faceEdge = NULL;
	Edge* firstFaceEdge = NULL;

#ifdef SHOW_ITERATIONS
	int m = 0;
#endif
	while (true)
	{
#ifdef SHOW_ITERATIONS
		m++;
#endif
#ifdef DEBUG_CONVEX_HULL
		printf("Intersecting edge is ");
		intersection->print();
		printf("\n");
#endif
		if (cmp == 0)
		{
			Edge* e = intersection->reverse->next;
			startEdge = e;
#ifdef SHOW_ITERATIONS
			n = 0;
#endif
			while (true)
			{
#ifdef SHOW_ITERATIONS
				n++;
#endif
				if (e->target->dot(normal).compare(shiftedDot) >= 0)
				{
					break;
				}
				intersection = e->reverse;
				e = e->next;
				if (e == startEdge)
				{
					return true;
				}
			}
#ifdef SHOW_ITERATIONS
			printf("Needed %d iterations to advance intersection\n", n);
#endif
		}

#ifdef DEBUG_CONVEX_HULL
		printf("Advanced intersecting edge to ");
		intersection->print();
		printf(", cmp = %d\n", cmp);
#endif

		if (!firstIntersection)
		{
			firstIntersection = intersection;
		}
		else if (intersection == firstIntersection)
		{
			break;
		}

		int prevCmp = cmp;
		Edge* prevIntersection = intersection;
		Edge* prevFaceEdge = faceEdge;

		Edge* e = intersection->reverse;
#ifdef SHOW_ITERATIONS
		n = 0;
#endif
		while (true)
		{
#ifdef SHOW_ITERATIONS
			n++;
#endif
			e = e->reverse->prev;
			btAssert(e != intersection->reverse);
			cmp = e->target->dot(normal).compare(shiftedDot);
#ifdef DEBUG_CONVEX_HULL
			printf("Testing edge ");
			e->print();
			printf(" -> cmp = %d\n", cmp);
#endif
			if (cmp >= 0)
			{
				intersection = e;
				break;
			}
		}
#ifdef SHOW_ITERATIONS
		printf("Needed %d iterations to find other intersection of face\n", n);
#endif

		if (cmp > 0)
		{
			Vertex* removed = intersection->target;
			e = intersection->reverse;
			if (e->prev == e)
			{
				removed->edges = NULL;
			}
			else
			{
				removed->edges = e->prev;
				e->prev->link(e->next);
				e->link(e);
			}
#ifdef DEBUG_CONVEX_HULL
			printf("1: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
			
			Point64 n0 = intersection->face->getNormal();
			Point64 n1 = intersection->reverse->face->getNormal();
			int64_t m00 = face->dir0.dot(n0);
			int64_t m01 = face->dir1.dot(n0);
			int64_t m10 = face->dir0.dot(n1);
			int64_t m11 = face->dir1.dot(n1);
			int64_t r0 = (intersection->face->origin - shiftedOrigin).dot(n0);
			int64_t r1 = (intersection->reverse->face->origin - shiftedOrigin).dot(n1);
			Int128 det = Int128::mul(m00, m11) - Int128::mul(m01, m10);
			btAssert(det.getSign() != 0);
			Vertex* v = vertexPool.newObject();
			v->point.index = -1;
			v->copy = -1;
			v->point128 = PointR128(Int128::mul(face->dir0.x * r0, m11) - Int128::mul(face->dir0.x * r1, m01)
															+ Int128::mul(face->dir1.x * r1, m00) - Int128::mul(face->dir1.x * r0, m10) + det * shiftedOrigin.x,
															Int128::mul(face->dir0.y * r0, m11) - Int128::mul(face->dir0.y * r1, m01)
															+ Int128::mul(face->dir1.y * r1, m00) - Int128::mul(face->dir1.y * r0, m10) + det * shiftedOrigin.y,
															Int128::mul(face->dir0.z * r0, m11) - Int128::mul(face->dir0.z * r1, m01)
															+ Int128::mul(face->dir1.z * r1, m00) - Int128::mul(face->dir1.z * r0, m10) + det * shiftedOrigin.z,
															det);
			v->point.x = (int32_t) v->point128.xvalue();
			v->point.y = (int32_t) v->point128.yvalue();
			v->point.z = (int32_t) v->point128.zvalue();
			intersection->target = v;
			v->edges = e;

			stack.push_back(v);
			stack.push_back(removed);
			stack.push_back(NULL);
		}

		if (cmp || prevCmp || (prevIntersection->reverse->next->target != intersection->target))
		{
			faceEdge = newEdgePair(prevIntersection->target, intersection->target);
			if (prevCmp == 0)
			{
				faceEdge->link(prevIntersection->reverse->next);
			}
			if ((prevCmp == 0) || prevFaceEdge)
			{
				prevIntersection->reverse->link(faceEdge);
			}
			if (cmp == 0)
			{
				intersection->reverse->prev->link(faceEdge->reverse);
			}
			faceEdge->reverse->link(intersection->reverse);
		}
		else
		{
			faceEdge = prevIntersection->reverse->next;
		}

		if (prevFaceEdge)
		{
			if (prevCmp > 0)
			{
				faceEdge->link(prevFaceEdge->reverse);
			}
			else if (faceEdge != prevFaceEdge->reverse)
			{
				stack.push_back(prevFaceEdge->target);
				while (faceEdge->next != prevFaceEdge->reverse)
				{
					Vertex* removed = faceEdge->next->target;
					removeEdgePair(faceEdge->next);
					stack.push_back(removed);
#ifdef DEBUG_CONVEX_HULL
					printf("2: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
				}
				stack.push_back(NULL);
			}
		}
		faceEdge->face = face;
		faceEdge->reverse->face = intersection->face;

		if (!firstFaceEdge)
		{
			firstFaceEdge = faceEdge;
		}
	}
#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to process all intersections\n", m);
#endif

	if (cmp > 0)
	{
		firstFaceEdge->reverse->target = faceEdge->target;
		firstIntersection->reverse->link(firstFaceEdge);
		firstFaceEdge->link(faceEdge->reverse);
	}
	else if (firstFaceEdge != faceEdge->reverse)
	{
		stack.push_back(faceEdge->target);
		while (firstFaceEdge->next != faceEdge->reverse)
		{
			Vertex* removed = firstFaceEdge->next->target;
			removeEdgePair(firstFaceEdge->next);
			stack.push_back(removed);
#ifdef DEBUG_CONVEX_HULL
			printf("3: Removed part contains (%d %d %d)\n", removed->point.x, removed->point.y, removed->point.z);
#endif
		}
		stack.push_back(NULL);
	}

	btAssert(stack.size() > 0);
	vertexList = stack[0];

#ifdef DEBUG_CONVEX_HULL
	printf("Removing part\n");
#endif
#ifdef SHOW_ITERATIONS
	n = 0;
#endif
	int pos = 0;
	while (pos < stack.size())
	{
		int end = stack.size();
		while (pos < end)
		{
			Vertex* kept = stack[pos++];
#ifdef DEBUG_CONVEX_HULL
			kept->print();
#endif
			bool deeper = false;
			Vertex* removed;
			while ((removed = stack[pos++]) != NULL)
			{
#ifdef SHOW_ITERATIONS
				n++;
#endif
				kept->receiveNearbyFaces(removed);
				while (removed->edges)
				{
					if (!deeper)
					{
						deeper = true;
						stack.push_back(kept);
					}
					stack.push_back(removed->edges->target);
					removeEdgePair(removed->edges);
				}
			}
			if (deeper)
			{
				stack.push_back(NULL);
			}
		}
	}
#ifdef SHOW_ITERATIONS
	printf("Needed %d iterations to remove part\n", n);
#endif

	stack.resize(0);
	face->origin = shiftedOrigin;

	return true;
}